

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

SXML_CHAR * str2html(SXML_CHAR *str,SXML_CHAR *html)

{
  char cVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  SXML_CHAR *pSVar5;
  
  if (html == str || str == (SXML_CHAR *)0x0) {
LAB_00105eb3:
    pSVar5 = (SXML_CHAR *)0x0;
  }
  else {
    pSVar5 = html;
    if (html == (SXML_CHAR *)0x0) {
      iVar3 = strlen_html(str);
      html = (SXML_CHAR *)malloc((long)iVar3);
      pSVar5 = html;
      if (html == (SXML_CHAR *)0x0) goto LAB_00105eb3;
    }
    for (; cVar1 = *str, cVar1 != '\0'; str = str + 1) {
      lVar2 = 0;
      do {
        lVar4 = lVar2;
        if (lVar4 + 0x18 == 0x90) {
          if (html != str) {
            *html = cVar1;
          }
          goto LAB_00105f25;
        }
        lVar2 = lVar4 + 0x18;
      } while (cVar1 != (&HTML_SPECIAL_DICT[0].chr)[lVar4]);
      strcpy(html,*(char **)((long)&HTML_SPECIAL_DICT[0].html + lVar4));
      html = html + (long)*(int *)((long)&HTML_SPECIAL_DICT[0].html_len + lVar4) + -1;
LAB_00105f25:
      html = html + 1;
    }
    *html = '\0';
  }
  return pSVar5;
}

Assistant:

SXML_CHAR* str2html(SXML_CHAR* str, SXML_CHAR* html)
{
	SXML_CHAR *ps, *pd;
	int i;

	if (str == NULL)
		return NULL;

	if (html == str) /* Not handled (yet) */
		return NULL;

	if (html == NULL) { /* Allocate 'html' to the correct size */
		html = __malloc(strlen_html(str) * sizeof(SXML_CHAR));
		if (html == NULL)
			return NULL;
	}

	for (ps = str, pd = html; *ps; ps++, pd++) {
		for (i = 0; HTML_SPECIAL_DICT[i].chr; i++) {
			if (*ps == HTML_SPECIAL_DICT[i].chr) {
				sx_strcpy(pd, HTML_SPECIAL_DICT[i].html);
				pd += HTML_SPECIAL_DICT[i].html_len - 1;
				break;
			}
		}
		if (HTML_SPECIAL_DICT[i].chr == NULC && pd != ps)
			*pd = *ps;
	}
	*pd = NULC;

	return html;
}